

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  allocator<Teacher> *this_00;
  allocator<Room> *this_01;
  allocator<Subject> *this_02;
  allocator<Group> *this_03;
  initializer_list<Group> __l;
  initializer_list<Subject> __l_00;
  initializer_list<Room> __l_01;
  initializer_list<Teacher> __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  bool bVar1;
  ostream *poVar2;
  DNA *pDVar3;
  reference __k;
  reference __in;
  type *ptVar4;
  type *this_04;
  mapped_type *this_05;
  reference pCVar5;
  Group *local_d78;
  Subject *local_d30;
  Teacher *local_c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_be8;
  Class *class_;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  mapped_type *listOfClasses;
  type *schedulePerGroup;
  type *group;
  _Self local_b48;
  iterator __end2;
  iterator __begin2;
  map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  *__range2;
  Day *mainDay;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  schedule;
  undefined1 local_ad8 [4];
  int iterations;
  Population population;
  DataStorage data;
  vector<Subject,_std::allocator<Subject>_> local_a38;
  allocator<char> local_a19;
  string local_a18;
  vector<Subject,_std::allocator<Subject>_> local_9f8;
  allocator<char> local_9d9;
  string local_9d8;
  vector<Subject,_std::allocator<Subject>_> local_9b8;
  allocator<char> local_999;
  string local_998;
  Group *local_978;
  Group local_970;
  Group local_928;
  Group local_8e0;
  iterator local_898;
  size_type local_890;
  undefined1 local_888 [8];
  vector<Group,_std::allocator<Group>_> groups;
  vector<Teacher,_std::allocator<Teacher>_> local_868;
  allocator<char> local_849;
  string local_848;
  vector<Teacher,_std::allocator<Teacher>_> local_828;
  allocator<char> local_809;
  string local_808;
  vector<Teacher,_std::allocator<Teacher>_> local_7e8;
  allocator<char> local_7c9;
  string local_7c8;
  vector<Teacher,_std::allocator<Teacher>_> local_7a8;
  allocator<char> local_789;
  string local_788;
  vector<Teacher,_std::allocator<Teacher>_> local_768;
  allocator<char> local_749;
  string local_748;
  vector<Teacher,_std::allocator<Teacher>_> local_728;
  allocator<char> local_709;
  string local_708;
  vector<Teacher,_std::allocator<Teacher>_> local_6e8;
  allocator<char> local_6c9;
  string local_6c8;
  vector<Teacher,_std::allocator<Teacher>_> local_6a8;
  allocator<char> local_689;
  string local_688;
  vector<Teacher,_std::allocator<Teacher>_> local_668;
  allocator<char> local_649;
  string local_648;
  Subject *local_628;
  Subject local_620;
  Subject local_5e8;
  Subject local_5b0;
  Subject local_578;
  Subject local_540;
  Subject local_508;
  Subject local_4d0;
  Subject local_498;
  Subject local_460;
  iterator local_428;
  size_type local_420;
  undefined1 local_418 [8];
  vector<Subject,_std::allocator<Subject>_> subjects;
  Room local_3f8;
  Room local_3e8;
  Room local_3d8;
  Room local_3c8;
  Room local_3b8;
  Room local_3a8;
  iterator local_398;
  size_type local_390;
  undefined1 local_388 [8];
  vector<Room,_std::allocator<Room>_> rooms;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  Teacher *local_230;
  Teacher local_228;
  Teacher local_208;
  Teacher local_1e8;
  Teacher local_1c8;
  Teacher local_1a8;
  Teacher local_188;
  Teacher local_168;
  Teacher local_148;
  iterator local_128;
  size_type local_120;
  undefined1 local_118 [8];
  vector<Teacher,_std::allocator<Teacher>_> teachers;
  allocator<char> local_f8;
  allocator<char> local_f7;
  allocator<char> local_f6;
  allocator<char> local_f5 [20];
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  days;
  
  days.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  teachers.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  local_e0 = &local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Monday",&local_e1);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"Tuesday",local_f5);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"Wednesday",&local_f6);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"Thursday",&local_f7);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"Friday",&local_f8);
  teachers.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  local_38 = &local_d8;
  local_30 = 5;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&teachers.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l_03._M_len = local_30;
  __l_03._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l_03,this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&teachers.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 6));
  local_be8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_be8 = local_be8 + -1;
    std::__cxx11::string::~string((string *)local_be8);
  } while (local_be8 != &local_d8);
  std::allocator<char>::~allocator(&local_f8);
  std::allocator<char>::~allocator(&local_f7);
  std::allocator<char>::~allocator(&local_f6);
  std::allocator<char>::~allocator(local_f5);
  std::allocator<char>::~allocator(&local_e1);
  rooms.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  local_230 = &local_228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"Merk",&local_251);
  Teacher::Teacher(&local_228,&local_250);
  local_230 = &local_208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"Margo",&local_279);
  Teacher::Teacher(&local_208,&local_278);
  local_230 = &local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"Fish",&local_2a1);
  Teacher::Teacher(&local_1e8,&local_2a0);
  local_230 = &local_1c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"Roma",&local_2c9);
  Teacher::Teacher(&local_1c8,&local_2c8);
  local_230 = &local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"Pokemon",&local_2f1);
  Teacher::Teacher(&local_1a8,&local_2f0);
  local_230 = &local_188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"Biba",&local_319);
  Teacher::Teacher(&local_188,&local_318);
  local_230 = &local_168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"Nika",&local_341);
  Teacher::Teacher(&local_168,&local_340);
  local_230 = &local_148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"Vlad",
             (allocator<char> *)
             ((long)&rooms.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  Teacher::Teacher(&local_148,&local_368);
  rooms.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  local_128 = &local_228;
  local_120 = 8;
  this_00 = (allocator<Teacher> *)
            ((long)&rooms.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<Teacher>::allocator(this_00);
  __l_02._M_len = local_120;
  __l_02._M_array = local_128;
  std::vector<Teacher,_std::allocator<Teacher>_>::vector
            ((vector<Teacher,_std::allocator<Teacher>_> *)local_118,__l_02,this_00);
  std::allocator<Teacher>::~allocator
            ((allocator<Teacher> *)
             ((long)&rooms.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5));
  local_c80 = (Teacher *)&local_128;
  do {
    local_c80 = local_c80 + -1;
    Teacher::~Teacher(local_c80);
  } while (local_c80 != &local_228);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rooms.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  Room::Room(&local_3f8,0xd7,0x1e);
  Room::Room(&local_3e8,0x1f9,0x23);
  Room::Room(&local_3d8,1,0x1b);
  Room::Room(&local_3c8,0x27,100);
  Room::Room(&local_3b8,0x12f,0x19);
  Room::Room(&local_3a8,0x1b,0x23);
  local_398 = &local_3f8;
  local_390 = 6;
  this_01 = (allocator<Room> *)
            ((long)&subjects.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Room>::allocator(this_01);
  __l_01._M_len = local_390;
  __l_01._M_array = local_398;
  std::vector<Room,_std::allocator<Room>_>::vector
            ((vector<Room,_std::allocator<Room>_> *)local_388,__l_01,this_01);
  std::allocator<Room>::~allocator
            ((allocator<Room> *)
             ((long)&subjects.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  groups.super__Vector_base<Group,_std::allocator<Group>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  local_628 = &local_620;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"Algebra",&local_649);
  GetRandomSubsetOfTeachers(&local_668,(vector<Teacher,_std::allocator<Teacher>_> *)local_118);
  Subject::Subject(&local_620,&local_648,&local_668);
  local_628 = &local_5e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"Geometry",&local_689);
  GetRandomSubsetOfTeachers(&local_6a8,(vector<Teacher,_std::allocator<Teacher>_> *)local_118);
  Subject::Subject(&local_5e8,&local_688,&local_6a8);
  local_628 = &local_5b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"Programming",&local_6c9);
  GetRandomSubsetOfTeachers(&local_6e8,(vector<Teacher,_std::allocator<Teacher>_> *)local_118);
  Subject::Subject(&local_5b0,&local_6c8,&local_6e8);
  local_628 = &local_578;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"Discrete Math",&local_709);
  GetRandomSubsetOfTeachers(&local_728,(vector<Teacher,_std::allocator<Teacher>_> *)local_118);
  Subject::Subject(&local_578,&local_708,&local_728);
  local_628 = &local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"DataStorage science",&local_749);
  GetRandomSubsetOfTeachers(&local_768,(vector<Teacher,_std::allocator<Teacher>_> *)local_118);
  Subject::Subject(&local_540,&local_748,&local_768);
  local_628 = &local_508;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"DataStorage structures",&local_789);
  GetRandomSubsetOfTeachers(&local_7a8,(vector<Teacher,_std::allocator<Teacher>_> *)local_118);
  Subject::Subject(&local_508,&local_788,&local_7a8);
  local_628 = &local_4d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c8,"Math Anal.",&local_7c9);
  GetRandomSubsetOfTeachers(&local_7e8,(vector<Teacher,_std::allocator<Teacher>_> *)local_118);
  Subject::Subject(&local_4d0,&local_7c8,&local_7e8);
  local_628 = &local_498;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"Prob. Th.",&local_809);
  GetRandomSubsetOfTeachers(&local_828,(vector<Teacher,_std::allocator<Teacher>_> *)local_118);
  Subject::Subject(&local_498,&local_808,&local_828);
  local_628 = &local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_848,"Algorithms",&local_849);
  GetRandomSubsetOfTeachers(&local_868,(vector<Teacher,_std::allocator<Teacher>_> *)local_118);
  Subject::Subject(&local_460,&local_848,&local_868);
  groups.super__Vector_base<Group,_std::allocator<Group>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  local_428 = &local_620;
  local_420 = 9;
  this_02 = (allocator<Subject> *)
            ((long)&groups.super__Vector_base<Group,_std::allocator<Group>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<Subject>::allocator(this_02);
  __l_00._M_len = local_420;
  __l_00._M_array = local_428;
  std::vector<Subject,_std::allocator<Subject>_>::vector
            ((vector<Subject,_std::allocator<Subject>_> *)local_418,__l_00,this_02);
  std::allocator<Subject>::~allocator
            ((allocator<Subject> *)
             ((long)&groups.super__Vector_base<Group,_std::allocator<Group>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6));
  local_d30 = (Subject *)&local_428;
  do {
    local_d30 = local_d30 + -1;
    Subject::~Subject(local_d30);
  } while (local_d30 != &local_620);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_868);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator(&local_849);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_828);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator(&local_809);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_7e8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator(&local_7c9);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_7a8);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator(&local_789);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_768);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_728);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_6e8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_6a8);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator(&local_689);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_668);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  data.LESSONS_PER_DAY._7_1_ = 1;
  local_978 = &local_970;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"TTP-42",&local_999);
  GetRandomSubsetOfSubjects(&local_9b8,(vector<Subject,_std::allocator<Subject>_> *)local_418);
  Group::Group(&local_970,&local_998,&local_9b8,0x14);
  local_978 = &local_928;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d8,"TTP-41",&local_9d9);
  GetRandomSubsetOfSubjects(&local_9f8,(vector<Subject,_std::allocator<Subject>_> *)local_418);
  Group::Group(&local_928,&local_9d8,&local_9f8,0x1e);
  local_978 = &local_8e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"MI-4",&local_a19);
  GetRandomSubsetOfSubjects(&local_a38,(vector<Subject,_std::allocator<Subject>_> *)local_418);
  Group::Group(&local_8e0,&local_a18,&local_a38,0x1a);
  data.LESSONS_PER_DAY._7_1_ = 0;
  local_898 = &local_970;
  local_890 = 3;
  this_03 = (allocator<Group> *)((long)&data.LESSONS_PER_DAY + 6);
  std::allocator<Group>::allocator(this_03);
  __l._M_len = local_890;
  __l._M_array = local_898;
  std::vector<Group,_std::allocator<Group>_>::vector
            ((vector<Group,_std::allocator<Group>_> *)local_888,__l,this_03);
  std::allocator<Group>::~allocator((allocator<Group> *)((long)&data.LESSONS_PER_DAY + 6));
  local_d78 = (Group *)&local_898;
  do {
    local_d78 = local_d78 + -1;
    Group::~Group(local_d78);
  } while (local_d78 != &local_970);
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_a38);
  std::__cxx11::string::~string((string *)&local_a18);
  std::allocator<char>::~allocator(&local_a19);
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_9f8);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::allocator<char>::~allocator(&local_9d9);
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_9b8);
  std::__cxx11::string::~string((string *)&local_998);
  std::allocator<char>::~allocator(&local_999);
  DataStorage::DataStorage
            ((DataStorage *)&population.answer.fitness,
             (vector<Group,_std::allocator<Group>_> *)local_888,
             (vector<Subject,_std::allocator<Subject>_> *)local_418,
             (vector<Room,_std::allocator<Room>_> *)local_388,
             (vector<Teacher,_std::allocator<Teacher>_> *)local_118,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28,4);
  Population::Population
            ((Population *)local_ad8,(DataStorage *)&population.answer.fitness,0.02,0x32);
  schedule._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  while (bVar1 = Population::AnswerReady((Population *)local_ad8),
        !bVar1 && schedule._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < 5000000) {
    schedule._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         schedule._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1;
    Population::evolve((Population *)local_ad8);
    if ((int)schedule._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ % 100 == 0) {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          schedule._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"population size = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"mutation rate = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0.02);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"iterations = ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,schedule._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"answer is ready = ");
  bVar1 = Population::AnswerReady((Population *)local_ad8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  std::operator<<(poVar2,"\n\n\n");
  pDVar3 = Population::GetAnswer((Population *)local_ad8);
  std::
  map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  ::map((map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
         *)&__range1,
        (map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
         *)pDVar3);
  std::operator<<((ostream *)&std::cout,"=================================\n");
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_28);
  mainDay = (Day *)std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&mainDay), bVar1) {
    __k = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1);
    poVar2 = std::operator<<((ostream *)&std::cout,"[Day: ");
    poVar2 = std::operator<<(poVar2,(string *)__k);
    std::operator<<(poVar2,"]\n");
    __end2 = std::
             map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
             ::begin((map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
                      *)&__range1);
    local_b48._M_node =
         (_Base_ptr)
         std::
         map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
         ::end((map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
                *)&__range1);
    while (bVar1 = std::operator!=(&__end2,&local_b48), bVar1) {
      __in = std::
             _Rb_tree_iterator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>
             ::operator*(&__end2);
      ptVar4 = std::
               get<0ul,Group_const,std::map<std::__cxx11::string,std::vector<Class,std::allocator<Class>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Class,std::allocator<Class>>>>>>
                         (__in);
      this_04 = std::
                get<1ul,Group_const,std::map<std::__cxx11::string,std::vector<Class,std::allocator<Class>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Class,std::allocator<Class>>>>>>
                          (__in);
      this_05 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>
                ::operator[](this_04,__k);
      poVar2 = std::operator<<((ostream *)&std::cout,"  Group: ");
      poVar2 = std::operator<<(poVar2,(string *)&ptVar4->name);
      std::operator<<(poVar2,"\n");
      __end3 = std::vector<Class,_std::allocator<Class>_>::begin(this_05);
      class_ = (Class *)std::vector<Class,_std::allocator<Class>_>::end(this_05);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>
                                         *)&class_), bVar1) {
        pCVar5 = __gnu_cxx::__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>
                 ::operator*(&__end3);
        poVar2 = std::operator<<((ostream *)&std::cout,"  ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pCVar5->time).number + 1);
        std::operator<<(poVar2,")\n");
        poVar2 = std::operator<<((ostream *)&std::cout,"  room = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pCVar5->room).number);
        std::operator<<(poVar2,"\n");
        poVar2 = std::operator<<((ostream *)&std::cout,"  lesson = ");
        poVar2 = std::operator<<(poVar2,(string *)&pCVar5->subject);
        std::operator<<(poVar2,"\n");
        poVar2 = std::operator<<((ostream *)&std::cout,"  teacher = ");
        poVar2 = std::operator<<(poVar2,(string *)&pCVar5->teacher);
        std::operator<<(poVar2,"\n");
        __gnu_cxx::__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>::
        operator++(&__end3);
      }
      std::operator<<((ostream *)&std::cout,"  --------------------\n");
      std::
      _Rb_tree_iterator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>
      ::operator++(&__end2);
    }
    std::operator<<((ostream *)&std::cout,"=================================\n");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  days.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::
  map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  ::~map((map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
          *)&__range1);
  Population::~Population((Population *)local_ad8);
  std::vector<Group,_std::allocator<Group>_>::~vector
            ((vector<Group,_std::allocator<Group>_> *)local_888);
  std::vector<Subject,_std::allocator<Subject>_>::~vector
            ((vector<Subject,_std::allocator<Subject>_> *)local_418);
  std::vector<Room,_std::allocator<Room>_>::~vector
            ((vector<Room,_std::allocator<Room>_> *)local_388);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector
            ((vector<Teacher,_std::allocator<Teacher>_> *)local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return days.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
    vector<Day> days = {"Monday", "Tuesday", "Wednesday", "Thursday", "Friday"}; // 5
    vector<Teacher> teachers = {
            Teacher("Merk"),
            Teacher("Margo"),
            Teacher("Fish"),
            Teacher("Roma"),
            Teacher("Pokemon"),
            Teacher("Biba"),
            Teacher("Nika"),
            Teacher("Vlad"),
    }; // 8
    vector<Room> rooms = {
            Room(215, 30),
            Room(505, 35),
            Room(1, 27),
            Room(39, 100),
            Room(303, 25),
            Room(27, 35),
    }; // 6
    vector<Subject> subjects = {
            Subject("Algebra", GetRandomSubsetOfTeachers(teachers)),
            Subject("Geometry", GetRandomSubsetOfTeachers(teachers)),
            Subject("Programming", GetRandomSubsetOfTeachers(teachers)),
            Subject("Discrete Math", GetRandomSubsetOfTeachers(teachers)),
            Subject("DataStorage science", GetRandomSubsetOfTeachers(teachers)),
            Subject("DataStorage structures", GetRandomSubsetOfTeachers(teachers)),
            Subject("Math Anal.", GetRandomSubsetOfTeachers(teachers)),
            Subject("Prob. Th.", GetRandomSubsetOfTeachers(teachers)),
            Subject("Algorithms", GetRandomSubsetOfTeachers(teachers)),
    }; // 9
    vector<Group> groups = {
            Group("TTP-42", GetRandomSubsetOfSubjects(subjects), 20),
            Group("TTP-41", GetRandomSubsetOfSubjects(subjects), 30),
            Group("MI-4", GetRandomSubsetOfSubjects(subjects), 26),
    };

    DataStorage data(groups, subjects, rooms, teachers, days, LESSONS_PER_DAY);

    Population population(data, MUTATION_RATE, POPULATION_SIZE);

    int iterations = 0;

    while (!population.AnswerReady() && iterations < EVOLUTION_MAX_ITERATIONS) {
        ++iterations;
        population.evolve();
        if (iterations % 100 == 0) {
            cout << iterations << endl;
        }
    }

    cout << "population size = " << POPULATION_SIZE << "\n";
    cout << "mutation rate = " << MUTATION_RATE << "\n";
    cout << "iterations = " << iterations << "\n";
    cout << "answer is ready = " << population.AnswerReady() << "\n\n\n";

    auto schedule = population.GetAnswer().schedule.schedule;

    cout << "=================================\n";

    for (const Day& mainDay : days) {
        cout << "[Day: " << mainDay << "]\n";

        for (auto&[group, schedulePerGroup] : schedule) {
            auto& listOfClasses = schedulePerGroup[mainDay];
            cout << "  Group: " << group.name << "\n";
            for (Class& class_ : listOfClasses) {
                cout << "  " << class_.time.number + 1 << ")\n";
                cout << "  room = " << class_.room.number << "\n";
                cout << "  lesson = " << class_.subject.name << "\n";
                cout << "  teacher = " << class_.teacher.name << "\n";
            }
            cout << "  --------------------\n";
        }
        cout << "=================================\n";
    }

    return 0;
}